

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderMultisampleInterpolationTests.cpp
# Opt level: O2

int __thiscall
deqp::gles31::Functional::anon_unknown_2::InterpolateAtSamplePositionCase::init
          (InterpolateAtSamplePositionCase *this,EVP_PKEY_CTX *ctx)

{
  ostringstream *this_00;
  bool bVar1;
  ContextType CVar2;
  int iVar3;
  NotSupportedError *this_01;
  EVP_PKEY_CTX *ctx_00;
  undefined1 local_198 [384];
  
  bVar1 = glu::ContextInfo::isExtensionSupported
                    (((this->super_MultisampleRenderCase).super_TestCase.m_context)->m_contextInfo,
                     "GL_OES_shader_multisample_interpolation");
  if (!bVar1) {
    CVar2.super_ApiType.m_bits =
         (ApiType)(*((this->super_MultisampleRenderCase).super_TestCase.m_context)->m_renderCtx->
                    _vptr_RenderContext[2])();
    bVar1 = glu::contextSupports(CVar2,(ApiType)0x23);
    if (!bVar1) {
      this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (this_01,"Test requires GL_OES_shader_multisample_interpolation extension",
                 (char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderMultisampleInterpolationTests.cpp"
                 ,0x552);
      goto LAB_012330f1;
    }
  }
  bVar1 = glu::ContextInfo::isExtensionSupported
                    (((this->super_MultisampleRenderCase).super_TestCase.m_context)->m_contextInfo,
                     "GL_OES_sample_variables");
  if (!bVar1) {
    CVar2.super_ApiType.m_bits =
         (ApiType)(*((this->super_MultisampleRenderCase).super_TestCase.m_context)->m_renderCtx->
                    _vptr_RenderContext[2])();
    bVar1 = glu::contextSupports(CVar2,(ApiType)0x23);
    if (!bVar1) {
      this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (this_01,"Test requires GL_OES_sample_variables extension",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderMultisampleInterpolationTests.cpp"
                 ,0x554);
LAB_012330f1:
      __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
  }
  local_198._0_8_ =
       ((this->super_MultisampleRenderCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)
       ->m_log;
  this_00 = (ostringstream *)(local_198 + 8);
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::operator<<((ostream *)this_00,
                  "Verifying that interpolateAtOffset with the offset of current sample position returns consistent values.\n"
                 );
  std::operator<<((ostream *)this_00,"\tInterpolate varying containing screen space location.\n");
  std::operator<<((ostream *)this_00,"\t=> interpolateAtOffset(varying, currentOffset) = varying");
  ctx_00 = (EVP_PKEY_CTX *)&tcu::TestLog::EndMessage;
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  iVar3 = MultisampleShaderRenderUtil::MultisampleRenderCase::init
                    (&this->super_MultisampleRenderCase,ctx_00);
  return iVar3;
}

Assistant:

void InterpolateAtSamplePositionCase::init (void)
{
	// requirements
	if (!m_context.getContextInfo().isExtensionSupported("GL_OES_shader_multisample_interpolation") && !glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2)))
		TCU_THROW(NotSupportedError, "Test requires GL_OES_shader_multisample_interpolation extension");
	if (!m_context.getContextInfo().isExtensionSupported("GL_OES_sample_variables") && !glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2)))
		TCU_THROW(NotSupportedError, "Test requires GL_OES_sample_variables extension");

	// test purpose and expectations
	m_testCtx.getLog()
		<< tcu::TestLog::Message
		<< "Verifying that interpolateAtOffset with the offset of current sample position returns consistent values.\n"
		<< "	Interpolate varying containing screen space location.\n"
		<< "	=> interpolateAtOffset(varying, currentOffset) = varying"
		<< tcu::TestLog::EndMessage;

	MultisampleShaderRenderUtil::MultisampleRenderCase::init();
}